

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O2

void __thiscall DummyTest_Size_Test::TestBody(DummyTest_Size_Test *this)

{
  char *message;
  int local_ec;
  AssertHelper local_e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  AssertionResult gtest_ar;
  Deque<int,_std::allocator<int>_> d;
  
  Deque<int,_std::allocator<int>_>::Deque(&d,(allocator<int> *)&gtest_ar);
  local_ec = 0;
  do {
    if (99 < local_ec) {
LAB_00132ca9:
      Deque<int,_std::allocator<int>_>::~Deque(&d);
      return;
    }
    Deque<int,_std::allocator<int>_>::push_back(&d,&local_ec);
    local_e0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Deque<int,_std::allocator<int>_>::size(&d);
    local_e8.data_._0_4_ = local_ec + 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar,"d.size()","i + 1",(unsigned_long *)&local_e0,(int *)&local_e8)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
                 ,0x16,message);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      goto LAB_00132ca9;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_ec = local_ec + 1;
  } while( true );
}

Assistant:

TEST(DummyTest, Size) {
    Deque<int> d;
    for (int i = 0; i < 100; ++i) {
        d.push_back(i);
        ASSERT_EQ(d.size(), i + 1);
    }
}